

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O2

TestObject * __thiscall StressTester::CreateRandom(StressTester *this)

{
  Recycler *recycler;
  TestObject *val;
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  TestObject *pTVar5;
  uint uVar6;
  int i;
  undefined8 *puVar7;
  ulong uVar8;
  ulong auStack_50 [3];
  StressTester *local_38;
  
  auStack_50[0] = 0x6bdbc2;
  local_38 = this;
  iVar3 = PAL_rand();
  uVar6 = iVar3 % 5000 + 1;
  uVar4 = (long)(iVar3 % 5000) * 8 + 0x37U & 0xfffffffffffffff0;
  lVar2 = -uVar4;
  puVar7 = (undefined8 *)((ulong)(&stack0xffffffffffffffd7 + -uVar4) & 0xffffffffffffffe0);
  uVar4 = 0;
  uVar8 = 0;
  if (0 < (int)uVar6) {
    uVar8 = (ulong)uVar6;
  }
  for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    recycler = local_38->recycler;
    *(undefined8 *)((long)auStack_50 + lVar2) = 0x6bdc18;
    iVar3 = PAL_rand();
    *(undefined8 *)((long)auStack_50 + lVar2) = 10;
    uVar1 = *(undefined8 *)((long)auStack_50 + lVar2);
    *(undefined8 *)((long)auStack_50 + lVar2) = 0x6bdc28;
    pTVar5 = TestObject::Create(recycler,(int)uVar1,(long)iVar3,NormalObj);
    puVar7[uVar4] = pTVar5;
  }
  auStack_50[2] = uVar8;
  for (uVar4 = 0; uVar4 != auStack_50[2]; uVar4 = uVar4 + 1) {
    *(undefined8 *)((long)auStack_50 + lVar2) = 5;
    uVar8 = *(ulong *)((long)auStack_50 + lVar2);
    while (iVar3 = (int)uVar8, uVar8 = (ulong)(iVar3 - 1), iVar3 != 0) {
      pTVar5 = (TestObject *)puVar7[uVar4];
      *(undefined8 *)((long)auStack_50 + lVar2) = 0x6bdc52;
      iVar3 = PAL_rand();
      val = (TestObject *)puVar7[iVar3 % (int)uVar6];
      *(undefined8 *)((long)auStack_50 + lVar2) = 0x6bdc65;
      TestObject::SetRandom(pTVar5,val);
    }
  }
  return (TestObject *)*puVar7;
}

Assistant:

TestObject *StressTester::CreateRandom()
{
    int numObjects = rand() % 5000 + 1;

    void *memory = _alloca(numObjects * sizeof(TestObject*)+OBJALIGN);
    TestObject **objs = reinterpret_cast<TestObject**>(AlignPtr(memory, OBJALIGN));

    // Create the objects
    for (int i = 0; i < numObjects; ++i)
    {
        objs[i] = TestObject::Create(recycler, 10, rand());
    }

    // Create links between objects
    for (int i = 0; i < numObjects; ++i)
    {
        for (int j = 0; j < 5; ++j)
        {
            objs[i]->SetRandom(objs[rand() % numObjects]);
        }
    }

    return objs[0];
}